

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O3

int stbtt_FindGlyphIndex(stbtt_fontinfo *info,int unicode_codepoint)

{
  long lVar1;
  ushort uVar2;
  uint in_EDX;
  ulong uVar3;
  ushort uVar4;
  stbtt_uint32 index_map;
  uint uVar5;
  uint uVar6;
  int iVar7;
  stbtt_uint8 *data;
  ulong uVar8;
  ushort uVar9;
  uint uVar10;
  uint uVar11;
  
  uVar8 = (ulong)(uint)unicode_codepoint;
  uVar4 = *(ushort *)((long)&info->userdata + uVar8);
  uVar2 = uVar4 << 8;
  uVar4 = uVar4 >> 8;
  uVar9 = uVar2 | uVar4;
  switch(uVar9) {
  case 0:
    uVar4 = *(ushort *)((long)&info->userdata + uVar8 + 2);
    if ((int)in_EDX < (int)((ushort)(uVar4 << 8 | uVar4 >> 8) - 6)) {
      return (int)*(byte *)((long)&info->userdata + (long)(int)in_EDX + uVar8 + 6);
    }
    break;
  default:
    if ((uVar2 | uVar4 & 0xfffe) == 0xc) {
      uVar5 = *(uint *)((long)&info->data + uVar8 + 4);
      uVar5 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      if (0 < (int)uVar5) {
        iVar7 = 0;
        do {
          uVar6 = ((int)(uVar5 - iVar7) >> 1) + iVar7;
          lVar1 = (long)(int)uVar6 * 0xc;
          uVar11 = *(uint *)((long)&info->fontstart + lVar1 + uVar8);
          uVar11 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                   uVar11 << 0x18;
          if (uVar11 <= in_EDX) {
            uVar10 = *(uint *)((long)&info->numGlyphs + lVar1 + uVar8);
            if (in_EDX <= (uVar10 >> 0x18 | (uVar10 & 0xff0000) >> 8 | (uVar10 & 0xff00) << 8 |
                          uVar10 << 0x18)) {
              uVar5 = *(uint *)((long)&info->loca + lVar1 + uVar8);
              iVar7 = 0;
              if (uVar9 == 0xc) {
                iVar7 = in_EDX - uVar11;
              }
              return iVar7 + (uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 |
                             uVar5 << 0x18);
            }
            iVar7 = uVar6 + 1;
            uVar6 = uVar5;
          }
          uVar5 = uVar6;
        } while (iVar7 < (int)uVar5);
      }
    }
    break;
  case 2:
    break;
  case 4:
    if ((int)in_EDX < 0x10000) {
      uVar4 = *(ushort *)((long)&info->userdata + uVar8 + 6);
      uVar2 = uVar4 << 8 | uVar4 >> 8;
      uVar4 = *(ushort *)((long)&info->data + uVar8 + 2);
      uVar9 = uVar4 << 8 | uVar4 >> 8;
      uVar3 = (ulong)(*(byte *)((long)&info->data + uVar8 + 5) & 0xfffffffe) |
              (ulong)*(byte *)((long)&info->data + uVar8 + 4) << 8;
      uVar4 = *(ushort *)((long)&info->userdata + uVar3 + (unicode_codepoint + 0xe));
      uVar11 = 0;
      uVar5 = (uint)uVar3;
      if ((int)in_EDX < (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
        uVar5 = uVar11;
      }
      uVar5 = uVar5 + unicode_codepoint + 0xc;
      if (uVar9 != 0) {
        uVar4 = *(ushort *)((long)&info->data + uVar8);
        uVar6 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
        do {
          uVar6 = uVar6 >> 1;
          uVar10 = uVar6 & 0xfffffffe;
          uVar4 = *(ushort *)((long)&info->userdata + (ulong)uVar10 + (ulong)uVar5);
          if ((int)in_EDX <= (int)(uint)(ushort)(uVar4 << 8 | uVar4 >> 8)) {
            uVar10 = 0;
          }
          uVar5 = uVar10 + uVar5;
          uVar9 = uVar9 - 1;
        } while (uVar9 != 0);
      }
      uVar3 = (ulong)((uVar5 - unicode_codepoint) + 0x1fff4 & 0x1fffe);
      uVar4 = *(ushort *)((long)&info->fontstart + uVar3 + (uVar2 & 0xfffffffe) + uVar8);
      uVar5 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
      if ((int)uVar5 <= (int)in_EDX) {
        uVar2 = uVar2 >> 1;
        lVar1 = (ulong)((uint)uVar2 + (uint)uVar2) * 3;
        uVar4 = *(ushort *)((long)&info->fontstart + uVar3 + lVar1 + uVar8 + 0xe + -0xe);
        uVar4 = uVar4 << 8 | uVar4 >> 8;
        if (uVar4 == 0) {
          uVar4 = *(ushort *)
                   ((long)&info->fontstart + uVar3 + (ulong)uVar2 * 4 + uVar8 + 0xe + -0xe);
          uVar11 = (ushort)(uVar4 << 8 | uVar4 >> 8) + in_EDX;
        }
        else {
          uVar4 = *(ushort *)
                   ((long)&info->fontstart +
                   uVar3 + (long)(int)((in_EDX - uVar5) * 2) + lVar1 + uVar8 + uVar4);
          uVar11 = (uint)(ushort)(uVar4 << 8 | uVar4 >> 8);
        }
      }
      return uVar11 & 0xffff;
    }
    break;
  case 6:
    uVar4 = *(ushort *)((long)&info->userdata + uVar8 + 6);
    uVar4 = uVar4 << 8 | uVar4 >> 8;
    if ((uVar4 <= in_EDX) &&
       (uVar2 = *(ushort *)((long)&info->data + uVar8),
       in_EDX < (uint)(ushort)(uVar2 << 8 | uVar2 >> 8) + (uint)uVar4)) {
      uVar4 = *(ushort *)((long)&info->data + (in_EDX - uVar4) * 2 + uVar8 + 2);
      return (int)(ushort)(uVar4 << 8 | uVar4 >> 8);
    }
  }
  return 0;
}

Assistant:

STBTT_DEF int stbtt_FindGlyphIndex(const stbtt_fontinfo *info, int unicode_codepoint)
{
   stbtt_uint8 *data = info->data;
   stbtt_uint32 index_map = info->index_map;

   stbtt_uint16 format = ttUSHORT(data + index_map + 0);
   if (format == 0) { // apple byte encoding
      stbtt_int32 bytes = ttUSHORT(data + index_map + 2);
      if (unicode_codepoint < bytes-6)
         return ttBYTE(data + index_map + 6 + unicode_codepoint);
      return 0;
   } else if (format == 6) {
      stbtt_uint32 first = ttUSHORT(data + index_map + 6);
      stbtt_uint32 count = ttUSHORT(data + index_map + 8);
      if ((stbtt_uint32) unicode_codepoint >= first && (stbtt_uint32) unicode_codepoint < first+count)
         return ttUSHORT(data + index_map + 10 + (unicode_codepoint - first)*2);
      return 0;
   } else if (format == 2) {
      STBTT_assert(0); // @TODO: high-byte mapping for japanese/chinese/korean
      return 0;
   } else if (format == 4) { // standard mapping for windows fonts: binary search collection of ranges
      stbtt_uint16 segcount = ttUSHORT(data+index_map+6) >> 1;
      stbtt_uint16 searchRange = ttUSHORT(data+index_map+8) >> 1;
      stbtt_uint16 entrySelector = ttUSHORT(data+index_map+10);
      stbtt_uint16 rangeShift = ttUSHORT(data+index_map+12) >> 1;

      // do a binary search of the segments
      stbtt_uint32 endCount = index_map + 14;
      stbtt_uint32 search = endCount;

      if (unicode_codepoint > 0xffff)
         return 0;

      // they lie from endCount .. endCount + segCount
      // but searchRange is the nearest power of two, so...
      if (unicode_codepoint >= ttUSHORT(data + search + rangeShift*2))
         search += rangeShift*2;

      // now decrement to bias correctly to find smallest
      search -= 2;
      while (entrySelector) {
         stbtt_uint16 end;
         searchRange >>= 1;
         end = ttUSHORT(data + search + searchRange*2);
         if (unicode_codepoint > end)
            search += searchRange*2;
         --entrySelector;
      }
      search += 2;

      {
         stbtt_uint16 offset, start;
         stbtt_uint16 item = (stbtt_uint16) ((search - endCount) >> 1);

         STBTT_assert(unicode_codepoint <= ttUSHORT(data + endCount + 2*item));
         start = ttUSHORT(data + index_map + 14 + segcount*2 + 2 + 2*item);
         if (unicode_codepoint < start)
            return 0;

         offset = ttUSHORT(data + index_map + 14 + segcount*6 + 2 + 2*item);
         if (offset == 0)
            return (stbtt_uint16) (unicode_codepoint + ttSHORT(data + index_map + 14 + segcount*4 + 2 + 2*item));

         return ttUSHORT(data + offset + (unicode_codepoint-start)*2 + index_map + 14 + segcount*6 + 2 + 2*item);
      }
   } else if (format == 12 || format == 13) {
      stbtt_uint32 ngroups = ttULONG(data+index_map+12);
      stbtt_int32 low,high;
      low = 0; high = (stbtt_int32)ngroups;
      // Binary search the right group.
      while (low < high) {
         stbtt_int32 mid = low + ((high-low) >> 1); // rounds down, so low <= mid < high
         stbtt_uint32 start_char = ttULONG(data+index_map+16+mid*12);
         stbtt_uint32 end_char = ttULONG(data+index_map+16+mid*12+4);
         if ((stbtt_uint32) unicode_codepoint < start_char)
            high = mid;
         else if ((stbtt_uint32) unicode_codepoint > end_char)
            low = mid+1;
         else {
            stbtt_uint32 start_glyph = ttULONG(data+index_map+16+mid*12+8);
            if (format == 12)
               return start_glyph + unicode_codepoint-start_char;
            else // format == 13
               return start_glyph;
         }
      }
      return 0; // not found
   }
   // @TODO
   STBTT_assert(0);
   return 0;
}